

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int parse_cookie_header(Curl_easy *data,Cookie *co,CookieInfo *ci,char *ptr,char *domain,char *path,
                       _Bool secure)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  CURLofft CVar4;
  size_t sVar5;
  time_t tVar6;
  char *pcVar7;
  void *pvVar8;
  time_t tVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  char *local_c8;
  char *local_b8;
  size_t pathlen;
  char *endslash;
  char *queryp;
  char *maxage;
  CURLofft offt;
  _Bool is_ip;
  char *valuep;
  char *namep;
  _Bool sep;
  size_t sStack_68;
  _Bool done;
  size_t nlen;
  size_t vlen;
  size_t linelength;
  time_t now;
  _Bool secure_local;
  char *path_local;
  char *domain_local;
  char *ptr_local;
  CookieInfo *ci_local;
  Cookie *co_local;
  Curl_easy *data_local;
  
  sVar5 = strlen(ptr);
  if (5000 < sVar5) {
    return 1;
  }
  tVar6 = time((time_t *)0x0);
  domain_local = ptr;
  while( true ) {
    while( true ) {
      pcVar10 = domain_local;
      bVar11 = false;
      if ((*domain_local != '\0') && (bVar11 = true, *domain_local != ' ')) {
        bVar11 = *domain_local == '\t';
      }
      if (!bVar11) break;
      domain_local = domain_local + 1;
    }
    sStack_68 = strcspn(domain_local,";\t\r\n=");
    if (sStack_68 != 0) {
      namep._7_1_ = false;
      bVar11 = false;
      pcVar7 = domain_local + sStack_68;
      while( true ) {
        bVar12 = false;
        if ((sStack_68 != 0) && (bVar12 = true, domain_local[sStack_68 - 1] != ' ')) {
          bVar12 = domain_local[sStack_68 - 1] == '\t';
        }
        if (!bVar12) break;
        sStack_68 = sStack_68 - 1;
      }
      if (*pcVar7 == '=') {
        _offt = pcVar7 + 1;
        nlen = strcspn(_offt,";\r\n");
        bVar11 = true;
        domain_local = _offt + nlen;
        while( true ) {
          bVar12 = false;
          if ((nlen != 0) && (bVar12 = true, _offt[nlen - 1] != ' ')) {
            bVar12 = _offt[nlen - 1] == '\t';
          }
          if (!bVar12) break;
          nlen = nlen - 1;
        }
        while( true ) {
          bVar12 = false;
          if ((nlen != 0) && (bVar12 = true, *_offt != ' ')) {
            bVar12 = *_offt == '\t';
          }
          if (!bVar12) break;
          _offt = _offt + 1;
          nlen = nlen - 1;
        }
        pvVar8 = memchr(_offt,9,nlen);
        if (pvVar8 != (void *)0x0) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"cookie contains TAB, dropping");
          }
          return 2;
        }
      }
      else {
        _offt = (char *)0x0;
        nlen = 0;
        domain_local = pcVar7;
      }
      if (((0xffe < sStack_68) || (0xffe < nlen)) || (0x1000 < sStack_68 + nlen)) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes",sStack_68,nlen);
        }
        return 3;
      }
      if (((6 < sStack_68) && (*pcVar10 == '_')) && (pcVar10[1] == '_')) {
        iVar3 = curl_strnequal("__Secure-",pcVar10,9);
        if (iVar3 == 0) {
          iVar3 = curl_strnequal("__Host-",pcVar10,7);
          if (iVar3 != 0) {
            co->field_0x74 = co->field_0x74 & 0xdf | 0x20;
          }
        }
        else {
          co->field_0x74 = co->field_0x74 & 0xef | 0x10;
        }
      }
      if (co->name == (char *)0x0) {
        if (!bVar11) {
          return 5;
        }
        strstore(&co->name,pcVar10,sStack_68);
        strstore(&co->value,_offt,nlen);
        namep._7_1_ = true;
        if ((co->name == (char *)0x0) || (co->value == (char *)0x0)) {
          return 6;
        }
        iVar3 = invalid_octets(co->value);
        if ((iVar3 != 0) || (iVar3 = invalid_octets(co->name), iVar3 != 0)) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"invalid octets in name/value, cookie dropped");
          }
          return 7;
        }
      }
      else if (nlen == 0) {
        namep._7_1_ = true;
        if ((sStack_68 == 6) && (iVar3 = curl_strnequal("secure",pcVar10,6), iVar3 != 0)) {
          if ((!secure) && ((ci->running & 1U) != 0)) {
            return 8;
          }
          co->field_0x74 = co->field_0x74 & 0xfd | 2;
        }
        else if ((sStack_68 == 8) && (iVar3 = curl_strnequal("httponly",pcVar10,8), iVar3 != 0)) {
          co->field_0x74 = co->field_0x74 & 0xf7 | 8;
        }
        else {
          namep._7_1_ = !bVar11;
        }
      }
      if (!namep._7_1_) {
        if ((sStack_68 == 4) && (iVar3 = curl_strnequal("path",pcVar10,4), iVar3 != 0)) {
          strstore(&co->path,_offt,nlen);
          if (co->path == (char *)0x0) {
            return 9;
          }
          (*Curl_cfree)(co->spath);
          pcVar10 = sanitize_cookie_path(co->path);
          co->spath = pcVar10;
          if (co->spath == (char *)0x0) {
            return 9;
          }
        }
        else if ((sStack_68 == 6) &&
                ((iVar3 = curl_strnequal("domain",pcVar10,6), iVar3 != 0 && (nlen != 0)))) {
          if (*_offt == '.') {
            _offt = _offt + 1;
            nlen = nlen - 1;
          }
          local_b8 = domain;
          if (domain == (char *)0x0) {
            local_b8 = _offt;
          }
          _Var1 = Curl_host_is_ipnum(local_b8);
          if ((domain != (char *)0x0) &&
             ((((!_Var1 || (iVar3 = strncmp(_offt,domain,nlen), iVar3 != 0)) ||
               (sVar5 = strlen(domain), nlen != sVar5)) &&
              ((_Var1 || (_Var2 = cookie_tailmatch(_offt,nlen,domain), !_Var2)))))) {
            if ((data != (Curl_easy *)0x0) &&
               (((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0 &&
                (((data->state).feat == (curl_trc_feat *)0x0 ||
                 (0 < ((data->state).feat)->log_level)))))) {
              Curl_infof(data,"skipped cookie with bad tailmatch domain: %s",_offt);
            }
            return 10;
          }
          strstore(&co->domain,_offt,nlen);
          if (co->domain == (char *)0x0) {
            return 9;
          }
          if (!_Var1) {
            co->field_0x74 = co->field_0x74 & 0xfe | 1;
          }
        }
        else if ((sStack_68 != 7) || (iVar3 = curl_strnequal("version",pcVar10,7), iVar3 == 0)) {
          if ((sStack_68 == 7) && (iVar3 = curl_strnequal("max-age",pcVar10,7), iVar3 != 0)) {
            if (*_offt == '\"') {
              local_c8 = _offt + 1;
            }
            else {
              local_c8 = _offt;
            }
            CVar4 = curlx_strtoofft(local_c8,(char **)0x0,10,&co->expires);
            if (CVar4 == CURL_OFFT_OK) {
              if (co->expires == 0) {
                co->expires = 1;
              }
              else if (0x7fffffffffffffff - tVar6 < co->expires) {
                co->expires = 0x7fffffffffffffff;
              }
              else {
                co->expires = tVar6 + co->expires;
              }
            }
            else if (CVar4 == CURL_OFFT_FLOW) {
              co->expires = 0x7fffffffffffffff;
            }
            else if (CVar4 == CURL_OFFT_INVAL) {
              co->expires = 1;
            }
          }
          else if ((sStack_68 == 7) &&
                  ((iVar3 = curl_strnequal("expires",pcVar10,7), iVar3 != 0 && (co->expires == 0))))
          {
            tVar9 = Curl_getdate_capped(_offt);
            co->expires = tVar9;
            if (co->expires == 0) {
              co->expires = 1;
            }
            else if (co->expires < 0) {
              co->expires = 0;
            }
          }
        }
      }
    }
    while( true ) {
      bVar11 = false;
      if ((*domain_local != '\0') && (bVar11 = true, *domain_local != ' ')) {
        bVar11 = *domain_local == '\t';
      }
      if (!bVar11) break;
      domain_local = domain_local + 1;
    }
    if (*domain_local != ';') break;
    domain_local = domain_local + 1;
  }
  if ((co->domain == (char *)0x0) && (domain != (char *)0x0)) {
    pcVar10 = (*Curl_cstrdup)(domain);
    co->domain = pcVar10;
    if (co->domain == (char *)0x0) {
      return 9;
    }
  }
  if ((co->path == (char *)0x0) && (path != (char *)0x0)) {
    pcVar10 = strchr(path,0x3f);
    if (pcVar10 == (char *)0x0) {
      pathlen = (size_t)strrchr(path,0x2f);
    }
    else {
      pathlen = (size_t)memrchr(path,0x2f,(long)pcVar10 - (long)path);
    }
    if (pathlen != 0) {
      pcVar10 = (char *)Curl_memdup0(path,(pathlen - (long)path) + 1);
      co->path = pcVar10;
      if (co->path == (char *)0x0) {
        return 9;
      }
      pcVar10 = sanitize_cookie_path(co->path);
      co->spath = pcVar10;
      if (co->spath == (char *)0x0) {
        return 9;
      }
    }
  }
  if (co->name == (char *)0x0) {
    data_local._4_4_ = 4;
  }
  else {
    (data->req).setcookies = (data->req).setcookies + '\x01';
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int
parse_cookie_header(struct Curl_easy *data,
                    struct Cookie *co,
                    struct CookieInfo *ci,
                    const char *ptr,
                    const char *domain, /* default domain */
                    const char *path,   /* full path used when this cookie is
                                           set, used to get default path for
                                           the cookie unless set */
                    bool secure)  /* TRUE if connection is over secure
                                     origin */
{
  /* This line was read off an HTTP-header */
  time_t now;
  size_t linelength = strlen(ptr);
  if(linelength > MAX_COOKIE_LINE)
    /* discard overly long lines at once */
    return CERR_TOO_LONG;

  now = time(NULL);
  do {
    size_t vlen;
    size_t nlen;

    while(*ptr && ISBLANK(*ptr))
      ptr++;

    /* we have a <name>=<value> pair or a stand-alone word here */
    nlen = strcspn(ptr, ";\t\r\n=");
    if(nlen) {
      bool done = FALSE;
      bool sep = FALSE;
      const char *namep = ptr;
      const char *valuep;

      ptr += nlen;

      /* trim trailing spaces and tabs after name */
      while(nlen && ISBLANK(namep[nlen - 1]))
        nlen--;

      if(*ptr == '=') {
        vlen = strcspn(++ptr, ";\r\n");
        valuep = ptr;
        sep = TRUE;
        ptr = &valuep[vlen];

        /* Strip off trailing whitespace from the value */
        while(vlen && ISBLANK(valuep[vlen-1]))
          vlen--;

        /* Skip leading whitespace from the value */
        while(vlen && ISBLANK(*valuep)) {
          valuep++;
          vlen--;
        }

        /* Reject cookies with a TAB inside the value */
        if(memchr(valuep, '\t', vlen)) {
          infof(data, "cookie contains TAB, dropping");
          return CERR_TAB;
        }
      }
      else {
        valuep = NULL;
        vlen = 0;
      }

      /*
       * Check for too long individual name or contents, or too long
       * combination of name + contents. Chrome and Firefox support 4095 or
       * 4096 bytes combo
       */
      if(nlen >= (MAX_NAME-1) || vlen >= (MAX_NAME-1) ||
         ((nlen + vlen) > MAX_NAME)) {
        infof(data, "oversized cookie dropped, name/val %zu + %zu bytes",
              nlen, vlen);
        return CERR_TOO_BIG;
      }

      /*
       * Check if we have a reserved prefix set before anything else, as we
       * otherwise have to test for the prefix in both the cookie name and
       * "the rest". Prefixes must start with '__' and end with a '-', so
       * only test for names where that can possibly be true.
       */
      if(nlen >= 7 && namep[0] == '_' && namep[1] == '_') {
        if(strncasecompare("__Secure-", namep, 9))
          co->prefix_secure = TRUE;
        else if(strncasecompare("__Host-", namep, 7))
          co->prefix_host = TRUE;
      }

      /*
       * Use strstore() below to properly deal with received cookie
       * headers that have the same string property set more than once,
       * and then we use the last one.
       */

      if(!co->name) {
        /* The very first name/value pair is the actual cookie name */
        if(!sep)
          /* Bad name/value pair. */
          return CERR_NO_SEP;

        strstore(&co->name, namep, nlen);
        strstore(&co->value, valuep, vlen);
        done = TRUE;
        if(!co->name || !co->value)
          return CERR_NO_NAME_VALUE;

        if(invalid_octets(co->value) || invalid_octets(co->name)) {
          infof(data, "invalid octets in name/value, cookie dropped");
          return CERR_INVALID_OCTET;
        }
      }
      else if(!vlen) {
        /*
         * this was a "<name>=" with no content, and we must allow
         * 'secure' and 'httponly' specified this weirdly
         */
        done = TRUE;
        /*
         * secure cookies are only allowed to be set when the connection is
         * using a secure protocol, or when the cookie is being set by
         * reading from file
         */
        if((nlen == 6) && strncasecompare("secure", namep, 6)) {
          if(secure || !ci->running) {
            co->secure = TRUE;
          }
          else {
            return CERR_BAD_SECURE;
          }
        }
        else if((nlen == 8) && strncasecompare("httponly", namep, 8))
          co->httponly = TRUE;
        else if(sep)
          /* there was a '=' so we are not done parsing this field */
          done = FALSE;
      }
      if(done)
        ;
      else if((nlen == 4) && strncasecompare("path", namep, 4)) {
        strstore(&co->path, valuep, vlen);
        if(!co->path)
          return CERR_OUT_OF_MEMORY;
        free(co->spath); /* if this is set again */
        co->spath = sanitize_cookie_path(co->path);
        if(!co->spath)
          return CERR_OUT_OF_MEMORY;
      }
      else if((nlen == 6) &&
              strncasecompare("domain", namep, 6) && vlen) {
        bool is_ip;

        /*
         * Now, we make sure that our host is within the given domain, or
         * the given domain is not valid and thus cannot be set.
         */

        if('.' == valuep[0]) {
          valuep++; /* ignore preceding dot */
          vlen--;
        }

#ifndef USE_LIBPSL
        /*
         * Without PSL we do not know when the incoming cookie is set on a
         * TLD or otherwise "protected" suffix. To reduce risk, we require a
         * dot OR the exact hostname being "localhost".
         */
        if(bad_domain(valuep, vlen))
          domain = ":";
#endif

        is_ip = Curl_host_is_ipnum(domain ? domain : valuep);

        if(!domain
           || (is_ip && !strncmp(valuep, domain, vlen) &&
               (vlen == strlen(domain)))
           || (!is_ip && cookie_tailmatch(valuep, vlen, domain))) {
          strstore(&co->domain, valuep, vlen);
          if(!co->domain)
            return CERR_OUT_OF_MEMORY;

          if(!is_ip)
            co->tailmatch = TRUE; /* we always do that if the domain name was
                                     given */
        }
        else {
          /*
           * We did not get a tailmatch and then the attempted set domain is
           * not a domain to which the current host belongs. Mark as bad.
           */
          infof(data, "skipped cookie with bad tailmatch domain: %s",
                valuep);
          return CERR_NO_TAILMATCH;
        }
      }
      else if((nlen == 7) && strncasecompare("version", namep, 7)) {
        /* just ignore */
      }
      else if((nlen == 7) && strncasecompare("max-age", namep, 7)) {
        /*
         * Defined in RFC2109:
         *
         * Optional. The Max-Age attribute defines the lifetime of the
         * cookie, in seconds. The delta-seconds value is a decimal non-
         * negative integer. After delta-seconds seconds elapse, the
         * client should discard the cookie. A value of zero means the
         * cookie should be discarded immediately.
         */
        CURLofft offt;
        const char *maxage = valuep;
        offt = curlx_strtoofft((*maxage == '\"') ?
                               &maxage[1] : &maxage[0], NULL, 10,
                               &co->expires);
        switch(offt) {
        case CURL_OFFT_FLOW:
          /* overflow, used max value */
          co->expires = CURL_OFF_T_MAX;
          break;
        case CURL_OFFT_INVAL:
          /* negative or otherwise bad, expire */
          co->expires = 1;
          break;
        case CURL_OFFT_OK:
          if(!co->expires)
            /* already expired */
            co->expires = 1;
          else if(CURL_OFF_T_MAX - now < co->expires)
            /* would overflow */
            co->expires = CURL_OFF_T_MAX;
          else
            co->expires += now;
          break;
        }
      }
      else if((nlen == 7) && strncasecompare("expires", namep, 7)) {
        if(!co->expires) {
          /*
           * Let max-age have priority.
           *
           * If the date cannot get parsed for whatever reason, the cookie
           * will be treated as a session cookie
           */
          co->expires = Curl_getdate_capped(valuep);

          /*
           * Session cookies have expires set to 0 so if we get that back
           * from the date parser let's add a second to make it a
           * non-session cookie
           */
          if(co->expires == 0)
            co->expires = 1;
          else if(co->expires < 0)
            co->expires = 0;
        }
      }

      /*
       * Else, this is the second (or more) name we do not know about!
       */
    }
    else {
      /* this is an "illegal" <what>=<this> pair */
    }

    while(*ptr && ISBLANK(*ptr))
      ptr++;
    if(*ptr == ';')
      ptr++;
    else
      break;
  } while(1);

  if(!co->domain && domain) {
    /* no domain was given in the header line, set the default */
    co->domain = strdup(domain);
    if(!co->domain)
      return CERR_OUT_OF_MEMORY;
  }

  if(!co->path && path) {
    /*
     * No path was given in the header line, set the default. Note that the
     * passed-in path to this function MAY have a '?' and following part that
     * MUST NOT be stored as part of the path.
     */
    char *queryp = strchr(path, '?');

    /*
     * queryp is where the interesting part of the path ends, so now we
     * want to the find the last
     */
    char *endslash;
    if(!queryp)
      endslash = strrchr(path, '/');
    else
      endslash = memrchr(path, '/', (queryp - path));
    if(endslash) {
      size_t pathlen = (endslash-path + 1); /* include end slash */
      co->path = Curl_memdup0(path, pathlen);
      if(co->path) {
        co->spath = sanitize_cookie_path(co->path);
        if(!co->spath)
          return CERR_OUT_OF_MEMORY;
      }
      else
        return CERR_OUT_OF_MEMORY;
    }
  }

  /*
   * If we did not get a cookie name, or a bad one, the this is an illegal
   * line so bail out.
   */
  if(!co->name)
    return CERR_BAD;

  data->req.setcookies++;
  return CERR_OK;
}